

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyself.c
# Opt level: O0

void polyman(char *fmt,char *arg)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  boolean was_blind;
  boolean could_pass_walls;
  boolean was_mimicking;
  boolean sticky;
  char *arg_local;
  char *fmt_local;
  
  bVar1 = sticks(youmonst.data);
  bVar4 = false;
  if ((bVar1 != '\0') && (bVar4 = false, u.ustuck != (monst *)0x0)) {
    bVar4 = (u._1052_1_ & 1) == 0;
  }
  bVar5 = youmonst.m_ap_type == '\x02';
  bVar6 = true;
  if ((u.uprops[0x3e].intrinsic == 0) && (bVar6 = true, u.uprops[0x3e].extrinsic == 0)) {
    bVar6 = ((youmonst.data)->mflags1 & 8) != 0;
  }
  if ((u.uprops[0x1e].intrinsic != 0) ||
     (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
      (bVar7 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
    bVar7 = false;
    if (ublindf != (obj *)0x0) {
      bVar7 = ublindf->oartifact == '\x1d';
    }
    bVar7 = (bool)(bVar7 ^ 1);
  }
  if (u.umonnum != u.umonster) {
    u.acurr.a[0] = u.macurr.a[0];
    u.acurr.a[1] = u.macurr.a[1];
    u.acurr.a[2] = u.macurr.a[2];
    u.acurr.a[3] = u.macurr.a[3];
    u.acurr.a[4] = u.macurr.a[4];
    u.acurr.a[5] = u.macurr.a[5];
    u.amax.a[0] = u.mamax.a[0];
    u.amax.a[1] = u.mamax.a[1];
    u.amax.a[2] = u.mamax.a[2];
    u.amax.a[3] = u.mamax.a[3];
    u.amax.a[4] = u.mamax.a[4];
    u.amax.a[5] = u.mamax.a[5];
    u.umonnum = u.umonster;
    flags.female = (byte)u._1052_1_ >> 3 & 1;
  }
  set_uasmon();
  u.mhmax = 0;
  u.mh = 0;
  u.mtimedone = 0;
  skinback('\0');
  u._1052_1_ = u._1052_1_ & 0xfb;
  if (bVar4) {
    uunstick();
  }
  find_ac();
  if (bVar5) {
    if (multi < 0) {
      unmul("");
    }
    youmonst.m_ap_type = '\0';
  }
  newsym((int)u.ux,(int)u.uy);
  pline(fmt,arg);
  bVar1 = is_playermon_genocided();
  if (bVar1 != '\0') {
    killer = delayed_killer;
    if ((delayed_killer == (char *)0x0) ||
       (pcVar3 = strstri(delayed_killer,"genocid"), pcVar3 == (char *)0x0)) {
      killer_format = 1;
      killer = "self-genocide";
    }
    done(10);
  }
  if ((u.twoweap != '\0') && ((youmonst.data)->mattk[1].aatyp != 0xfe)) {
    untwoweapon();
  }
  if ((u.utraptype == 1) && (bVar6)) {
    iVar2 = rn2(6);
    u.utrap = iVar2 + 2;
  }
  if ((bVar7) &&
     (((u.uprops[0x1e].intrinsic == 0 &&
       (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
        (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
      ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
    u.uprops[0x1e].intrinsic = 1;
    make_blinded(0,'\x01');
  }
  if ((((u.uprops[0x12].intrinsic == 0) && (u.uprops[0x12].extrinsic == 0)) &&
      (((youmonst.data)->mlet != '\x05' && (u.ustuck == (monst *)0x0)))) &&
     ((bVar1 = is_pool(level,(int)u.ux,(int)u.uy), bVar1 != '\0' ||
      (bVar1 = is_lava(level,(int)u.ux,(int)u.uy), bVar1 != '\0')))) {
    spoteffects('\x01');
  }
  see_monsters();
  return;
}

Assistant:

static void polyman(const char *fmt, const char *arg)
{
	boolean sticky = sticks(youmonst.data) && u.ustuck && !u.uswallow,
		was_mimicking = (youmonst.m_ap_type == M_AP_OBJECT);
	boolean could_pass_walls = Passes_walls;
	boolean was_blind = !!Blind;

	if (Upolyd) {
		u.acurr = u.macurr;	/* restore old attribs */
		u.amax = u.mamax;
		u.umonnum = u.umonster;
		flags.female = u.mfemale;
	}
	set_uasmon();

	u.mh = u.mhmax = 0;
	u.mtimedone = 0;
	skinback(FALSE);
	u.uundetected = 0;

	if (sticky) uunstick();
	find_ac();
	if (was_mimicking) {
	    if (multi < 0) unmul("");
	    youmonst.m_ap_type = M_AP_NOTHING;
	}

	newsym(u.ux,u.uy);

	pline(fmt, arg);
	/* check whether player foolishly genocided self while poly'd */
	if (is_playermon_genocided()) {
	    /* intervening activity might have clobbered genocide info */
	    killer = delayed_killer;
	    if (!killer || !strstri(killer, "genocid")) {
		killer_format = KILLED_BY;
		killer = "self-genocide";
	    }
	    done(GENOCIDED);
	}

	if (u.twoweap && !could_twoweap(youmonst.data))
	    untwoweapon();

	if (u.utraptype == TT_PIT) {
	    if (could_pass_walls) {	/* player forms cannot pass walls */
		u.utrap = rn1(6,2);
	    }
	}
	if (was_blind && !Blind) {	/* reverting from eyeless */
	    Blinded = 1L;
	    make_blinded(0L, TRUE);	/* remove blindness */
	}

	if (!Levitation && !u.ustuck &&
	   (is_pool(level, u.ux,u.uy) || is_lava(level, u.ux,u.uy)))
		spoteffects(TRUE);

	see_monsters();
}